

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alice.cpp
# Opt level: O2

void __thiscall Alice::LoadDataShare(Alice *this)

{
  long lVar1;
  int iVar2;
  bool bVar3;
  long local_280;
  ifstream fin;
  byte abStack_260 [488];
  undefined1 auStack_78 [8];
  vector<long,_std::allocator<long>_> Element;
  value_type local_58;
  long temp;
  undefined1 auStack_48 [8];
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  R;
  
  std::ifstream::ifstream(&local_280,"../inputs/alice/D_A.txt",_S_in);
  auStack_48 = (undefined1  [8])0x0;
  R.
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  R.
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::istream::_M_extract<long>(&local_280);
  temp = (long)this;
  while (lVar1 = temp, (abStack_260[*(long *)(local_280 + -0x18)] & 2) == 0) {
    auStack_78 = (undefined1  [8])0x0;
    Element.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    Element.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    iVar2 = 2;
    while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
      std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)auStack_78,&local_58);
      std::istream::_M_extract<long>(&local_280);
    }
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::push_back((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 *)auStack_48,(value_type *)auStack_78);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              ((_Vector_base<long,_std::allocator<long>_> *)auStack_78);
  }
  std::
  vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
  ::
  _M_assign_aux<__gnu_cxx::__normal_iterator<std::vector<long,std::allocator<long>>*,std::vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>>>
            ((vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
              *)(temp + 0x40),auStack_48,
             R.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  *(int *)(lVar1 + 4) = (int)((*(long *)(lVar1 + 0x48) - *(long *)(lVar1 + 0x40)) / 0x18);
  std::ifstream::close();
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             *)auStack_48);
  std::ifstream::~ifstream(&local_280);
  return;
}

Assistant:

void Alice::LoadDataShare()
{
    std::ifstream fin("../inputs/alice/D_A.txt");
    std::vector<std::vector<long>> R;
    long temp;
    fin>>temp;
    while(!fin.eof())
    {
        std::vector<long> Element;
        for (int j = 0; j < 2; j++)
        {
            Element.push_back(temp);
            fin >> temp;
        }
        R.push_back(Element);
    }
    D.assign(R.begin(), R.end());
    n_d = D.size();
    fin.close();
}